

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage1(Array2D<Imf_3_2::Rgba> *px,int w,int h)

{
  long lVar1;
  int iVar2;
  ushort uVar3;
  ulong uVar4;
  int iVar5;
  Rgba *__s;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  float lm;
  
  if (0 < h) {
    lVar1 = px->_sizeY;
    __s = px->_data;
    uVar4 = (ulong)(uint)h;
    do {
      if (0 < w) {
        memset(__s,0,(ulong)(uint)w << 3);
      }
      __s = __s + lVar1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  fVar6 = (float)w;
  fVar7 = (float)(w / 2);
  fVar8 = (float)h;
  fVar9 = (float)(h / 2);
  iVar5 = -0x2bc0;
  iVar2 = 1;
  uVar3 = 0;
  do {
    dVar12 = (double)(((float)(iVar5 + 0x2bc0) * 3.1415927) / 5600.0);
    dVar13 = sin(dVar12 + dVar12);
    dVar14 = sin(dVar12 * 15.0);
    fVar10 = (float)(dVar14 * 0.2 + dVar13);
    dVar13 = cos(dVar12 * 3.0);
    dVar14 = cos(dVar12 * 15.0);
    fVar11 = (float)(dVar14 * 0.2 + dVar13);
    dVar13 = (double)fVar10;
    dVar14 = (double)((float)iVar2 / 5600.0);
    dVar15 = dVar14 * 0.3;
    dVar12 = dVar12 * 80.0;
    dVar16 = sin(dVar12);
    dVar17 = (double)fVar11;
    dVar18 = cos(dVar12);
    dVar19 = sin(dVar12 + 1.5707963267948966);
    dVar12 = cos(dVar12 + 1.5707963267948966);
    if ((ushort)((short)iVar2 + (uVar3 / 5 & 0xfffe) * -5) == 1) {
      lm = (float)(dVar14 * 0.5 * dVar14);
      anon_unknown.dwarf_109f::sp
                (px,w,h,(fVar10 * fVar6) / 3.0 + fVar7,(fVar11 * fVar8) / 3.0 + fVar9,
                 (float)((double)w * 0.05 * dVar14),2.0,0.8,0.1,lm);
    }
    else {
      lm = (float)(dVar14 * 0.5 * dVar14);
    }
    fVar10 = (float)(dVar14 * (double)w * 0.01);
    anon_unknown.dwarf_109f::sp
              (px,w,h,((float)(dVar16 * dVar15 + dVar13) * fVar6) / 3.0 + fVar7,
               ((float)(dVar18 * dVar15 + dVar17) * fVar8) / 3.0 + fVar9,fVar10,0.7,0.2,2.0,lm);
    anon_unknown.dwarf_109f::sp
              (px,w,h,((float)(dVar19 * dVar15 + dVar13) * fVar6) / 3.0 + fVar7,
               ((float)(dVar12 * dVar15 + dVar17) * fVar8) / 3.0 + fVar9,fVar10,0.2,1.5,0.1,lm);
    iVar2 = iVar2 + 1;
    uVar3 = uVar3 + 1;
    iVar5 = iVar5 + 2;
  } while (iVar5 != 0);
  return;
}

Assistant:

void
drawImage1 (Array2D<Rgba>& px, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = px[y][x];
            p.r     = 0;
            p.g     = 0;
            p.b     = 0;
            p.a     = 0;
        }
    }

    int n = 5600;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 2.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float r  = float (i + 1) / float (n);
        float xq = xp + 0.3 * r * sin (t * 80.0);
        float yq = yp + 0.3 * r * cos (t * 80.0);
        float xr = xp + 0.3 * r * sin (t * 80.0 + M_PI / 2);
        float yr = yp + 0.3 * r * cos (t * 80.0 + M_PI / 2);

        if (i % 10 == 0)
            sp (px,
                w,
                h,
                xp * w / 3 + w / 2,
                yp * h / 3 + h / 2,
                w * 0.05 * r,
                2.0,
                0.8,
                0.1,
                0.5 * r * r);

        sp (px,
            w,
            h,
            xq * w / 3 + w / 2,
            yq * h / 3 + h / 2,
            w * 0.01 * r,
            0.7,
            0.2,
            2.0,
            0.5 * r * r);

        sp (px,
            w,
            h,
            xr * w / 3 + w / 2,
            yr * h / 3 + h / 2,
            w * 0.01 * r,
            0.2,
            1.5,
            0.1,
            0.5 * r * r);
    }
}